

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall
glcts::GeometryShaderRenderingCase::executeTest
          (GeometryShaderRenderingCase *this,_draw_call_type type)

{
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestError *pTVar4;
  void *pvVar5;
  uchar *rendered_data;
  undefined4 local_54;
  undefined4 local_50;
  uint single_rt_width;
  uint single_rt_height;
  uint rt_width;
  uint rt_height;
  GLuint read_fbo_id;
  GLint position_attribute_location;
  uint n_vertices;
  uint n_instances;
  uint n_instance;
  uint n_elements;
  GLenum mode;
  GLubyte min_elements_index;
  GLubyte max_elements_index;
  long lStack_20;
  GLenum index_type;
  Functions *gl;
  GLuint draw_fbo_id;
  _draw_call_type type_local;
  GeometryShaderRenderingCase *this_local;
  
  gl._0_4_ = 0;
  gl._4_4_ = type;
  _draw_fbo_id = this;
  pRVar3 = deqp::Context::getRenderContext(this->m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  mode = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x12])();
  iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x13])();
  n_elements._3_1_ = (undefined1)iVar1;
  iVar1 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x14])();
  n_elements._2_1_ = (undefined1)iVar1;
  n_instance = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[8])();
  n_instances = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[6])();
  n_vertices = 0;
  position_attribute_location =
       (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  read_fbo_id = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[7])();
  rt_height = (**(code **)(lStack_20 + 0x780))(this->m_po_id,"position");
  single_rt_height = 0;
  single_rt_width = 0;
  local_50 = 0;
  local_54 = 0;
  if (((gl._4_4_ == DRAW_CALL_TYPE_GL_DRAW_ARRAYS) || (gl._4_4_ == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS))
     || (gl._4_4_ == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)) {
    gl._0_4_ = this->m_fbo_id;
    position_attribute_location = 1;
    rt_width = this->m_read_fbo_id;
  }
  else {
    gl._0_4_ = this->m_instanced_fbo_id;
    rt_width = this->m_instanced_read_fbo_id;
  }
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (this,(ulong)(uint)position_attribute_location,&single_rt_width,&single_rt_height);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
            (this,1,&local_54,&local_50);
  switch(gl._4_4_) {
  case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
    (**(code **)(lStack_20 + 0x40))(0x8892,this->m_noninstanced_raw_arrays_bo_id);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
    (**(code **)(lStack_20 + 0x40))(0x8892,this->m_instanced_raw_arrays_bo_id);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
  case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
    (**(code **)(lStack_20 + 0x40))(0x8892,this->m_noninstanced_unordered_arrays_bo_id);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
    (**(code **)(lStack_20 + 0x40))(0x8892,this->m_instanced_unordered_arrays_bo_id);
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x2d8);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x19f0))(rt_height,4,0x1406,0,0,0);
  (**(code **)(lStack_20 + 0x610))(rt_height);
  switch(gl._4_4_) {
  case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
  case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
    (**(code **)(lStack_20 + 0x40))(0x8893,0);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
  case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
    (**(code **)(lStack_20 + 0x40))(0x8893,this->m_noninstanced_unordered_elements_bo_id);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
    (**(code **)(lStack_20 + 0x40))(0x8893,this->m_instanced_unordered_elements_bo_id);
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x2fc);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  (**(code **)(lStack_20 + 0x78))(0x8ca9,(GLuint)gl);
  (**(code **)(lStack_20 + 0x1a00))(0,0,single_rt_width,single_rt_height);
  (**(code **)(lStack_20 + 0x1c0))(0,0,0);
  (**(code **)(lStack_20 + 0x188))(0x4000);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Test set-up failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                  ,0x308);
  (**(code **)(lStack_20 + 0x1680))(this->m_po_id);
  (**(code **)(lStack_20 + 0x1530))
            (this->m_renderingTargetSize_uniform_location,single_rt_width,single_rt_height);
  (**(code **)(lStack_20 + 0x1530))
            (this->m_singleRenderingTargetSize_uniform_location,local_54,local_50);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x17])
            (this,(ulong)gl._4_4_);
  switch(gl._4_4_) {
  case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
    (**(code **)(lStack_20 + 0x538))(n_instance,0,read_fbo_id);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
    (**(code **)(lStack_20 + 0x548))(n_instance,0,read_fbo_id,position_attribute_location);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
    (**(code **)(lStack_20 + 0x568))(n_instance,n_instances,mode,0);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
    (**(code **)(lStack_20 + 0x580))(n_instance,n_instances,mode,0,position_attribute_location);
    break;
  case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
    (**(code **)(lStack_20 + 0x5a0))
              (n_instance,n_elements._2_1_,n_elements._3_1_,n_instances,mode,0);
    break;
  default:
    pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar4,"Unrecognized draw call mode",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
               ,0x339);
    __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"Draw call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                  ,0x33d);
  pvVar5 = operator_new__((ulong)(single_rt_height * single_rt_width * 4));
  (**(code **)(lStack_20 + 0x78))(0x8ca8,rt_width);
  (**(code **)(lStack_20 + 0x1220))(0,0,single_rt_width,single_rt_height,0x1908,0x1401,pvVar5);
  dVar2 = (**(code **)(lStack_20 + 0x800))();
  glu::checkError(dVar2,"glReadPixels() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                  ,0x345);
  for (n_vertices = 0; n_vertices < (uint)position_attribute_location; n_vertices = n_vertices + 1)
  {
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x16])
              (this,(ulong)gl._4_4_,(ulong)n_vertices,pvVar5);
  }
  if (pvVar5 != (void *)0x0) {
    operator_delete__(pvVar5);
  }
  return;
}

Assistant:

void GeometryShaderRenderingCase::executeTest(GeometryShaderRenderingCase::_draw_call_type type)
{
	glw::GLuint			  draw_fbo_id				  = 0;
	const glw::Functions& gl						  = m_context.getRenderContext().getFunctions();
	const glw::GLenum	 index_type				  = getUnorderedElementsDataType();
	const glw::GLubyte	max_elements_index		  = getUnorderedElementsMaxIndex();
	const glw::GLubyte	min_elements_index		  = getUnorderedElementsMinIndex();
	const glw::GLenum	 mode						  = getDrawCallMode();
	unsigned int		  n_elements				  = getAmountOfElementsPerInstance();
	unsigned int		  n_instance				  = 0;
	unsigned int		  n_instances				  = getAmountOfDrawInstances();
	const unsigned int	n_vertices				  = getAmountOfVerticesPerInstance();
	const glw::GLint	  position_attribute_location = gl.getAttribLocation(m_po_id, "position");
	glw::GLuint			  read_fbo_id				  = 0;
	unsigned int		  rt_height					  = 0;
	unsigned int		  rt_width					  = 0;
	unsigned int		  single_rt_height			  = 0;
	unsigned int		  single_rt_width			  = 0;

	/* Reduce n_instances to 1 for non-instanced draw call modes */
	if (type == DRAW_CALL_TYPE_GL_DRAW_ARRAYS || type == DRAW_CALL_TYPE_GL_DRAW_ELEMENTS ||
		type == DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS)
	{
		draw_fbo_id = m_fbo_id;
		n_instances = 1;
		read_fbo_id = m_read_fbo_id;
	}
	else
	{
		draw_fbo_id = m_instanced_fbo_id;
		read_fbo_id = m_instanced_read_fbo_id;
	}

	/* Retrieve render-target size */
	getRenderTargetSize(n_instances, &rt_width, &rt_height);
	getRenderTargetSize(1, &single_rt_width, &single_rt_height);

	/* Configure GL_ARRAY_BUFFER binding */
	switch (type)
	{
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_noninstanced_raw_arrays_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_instanced_raw_arrays_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_instanced_unordered_arrays_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
	case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
	{
		gl.bindBuffer(GL_ARRAY_BUFFER, m_noninstanced_unordered_arrays_bo_id);

		break;
	}

	default:
	{
		/* Unrecognized draw call mode */
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (type) */

	gl.vertexAttribPointer(position_attribute_location, 4, GL_FLOAT, GL_FALSE, 0 /* stride */, NULL);
	gl.enableVertexAttribArray(position_attribute_location);

	/* Configure GL_ELEMENT_ARRAY_BUFFER binding */
	switch (type)
	{
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, 0);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_instanced_unordered_elements_bo_id);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
	case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
	{
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_noninstanced_unordered_elements_bo_id);

		break;
	}

	default:
	{
		/* Unrecognized draw call mode */
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (type) */

	/* Configure draw framebuffer */
	gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, draw_fbo_id);
	gl.viewport(0 /* x */, 0 /* y */, rt_width, rt_height);

	/* Clear the color buffer. */
	gl.clearColor(0.0f /* red */, 0.0f /* green */, 0.0f /* blue */, 0.0f /* alpha */);
	gl.clear(GL_COLOR_BUFFER_BIT);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Test set-up failed.");

	/* Render the test geometry */
	gl.useProgram(m_po_id);
	gl.uniform2i(m_renderingTargetSize_uniform_location, rt_width, rt_height);
	gl.uniform2i(m_singleRenderingTargetSize_uniform_location, single_rt_width, single_rt_height);

	setUniformsBeforeDrawCall(type);

	switch (type)
	{
	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS:
	{
		gl.drawArrays(mode, 0 /* first */, n_vertices);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ARRAYS_INSTANCED:
	{
		gl.drawArraysInstanced(mode, 0 /* first */, n_vertices, n_instances);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS:
	{
		gl.drawElements(mode, n_elements, index_type, NULL);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_ELEMENTS_INSTANCED:
	{
		gl.drawElementsInstanced(mode, n_elements, index_type, NULL, n_instances);

		break;
	}

	case DRAW_CALL_TYPE_GL_DRAW_RANGE_ELEMENTS:
	{
		gl.drawRangeElements(mode, min_elements_index, max_elements_index, n_elements, index_type, NULL);

		break;
	}

	default:
	{
		/* Unrecognized draw call mode */
		TCU_FAIL("Unrecognized draw call mode");
	}
	} /* switch (type) */

	GLU_EXPECT_NO_ERROR(gl.getError(), "Draw call failed.");

	/* Retrieve rendered data */
	unsigned char* rendered_data = new unsigned char[rt_height * rt_width * 4 /* components */];

	gl.bindFramebuffer(GL_READ_FRAMEBUFFER, read_fbo_id);
	gl.readPixels(0 /* x */, 0 /* y */, rt_width, rt_height, GL_RGBA, GL_UNSIGNED_BYTE, rendered_data);

	GLU_EXPECT_NO_ERROR(gl.getError(), "glReadPixels() call failed");

	/* Verify if the test succeeded */
	for (n_instance = 0; n_instance < n_instances; ++n_instance)
	{
		verify(type, n_instance, rendered_data);
	} /* for (all instances) */

	/* Release the data buffer */
	delete[] rendered_data;
}